

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessHelp
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  pointer pbVar1;
  _Rb_tree_node_base *p_Var2;
  char *begin;
  char *pcVar3;
  _Rb_tree_node_base *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  Value local_120;
  string usage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  undefined1 local_58 [40];
  
  this_01 = &data;
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar1 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x20) {
    data._M_dataplus._M_p = (pointer)&data.field_2;
    data._M_string_length = 0;
    data.field_2._M_allocated_capacity = data.field_2._M_allocated_capacity & 0xffffffffffffff00;
    p_Var4 = (_Rb_tree_node_base *)(mEvaluatorMap_abi_cxx11_ + 8);
    for (p_Var2 = *(_Rb_tree_node_base **)(mEvaluatorMap_abi_cxx11_ + 0x18); p_Var2 != p_Var4;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var2 + 1),"\n");
      std::__cxx11::string::append((string *)&data);
      std::__cxx11::string::~string((string *)&local_120);
    }
    std::__cxx11::string::append((char *)&data);
    std::__cxx11::string::string((string *)&local_78,(string *)&data);
    Value::Value(&local_120,&local_78);
    Value::operator=(__return_storage_ptr__,&local_120);
    Value::~Value(&local_120);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::string((string *)&local_120,(string *)(pbVar1 + 1));
    __l._M_len = 1;
    __l._M_array = (iterator)&local_120;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_138,__l,(allocator_type *)&data);
    Usage(&usage,&local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    std::__cxx11::string::~string((string *)&local_120);
    if (usage._M_string_length == 0) {
      data._M_dataplus._M_p._0_4_ = 0xd;
      data._M_string_length = (size_type)anon_var_dwarf_3db7e;
      data.field_2._M_allocated_capacity = 0x19;
      data.field_2._8_8_ = 0x100000000;
      pcVar3 = "{} is not a valid command";
      while (begin = pcVar3, begin != "") {
        pcVar3 = begin + 1;
        if (*begin == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (begin,"",(format_string_checker<char> *)&data);
        }
      }
      pbVar1 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      data._M_dataplus._M_p = pbVar1[1]._M_dataplus._M_p;
      data._M_string_length = pbVar1[1]._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x19;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&data;
      ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"{} is not a valid command",fmt,args);
      local_58._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_98);
      Value::Value(&local_120,(Error *)local_58);
      Value::operator=(__return_storage_ptr__,&local_120);
      Value::~Value(&local_120);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      this_00 = &local_98;
    }
    else {
      std::operator+(&local_b8,"usage:\n",&usage);
      Value::Value(&local_120,&local_b8);
      Value::operator=(__return_storage_ptr__,&local_120);
      Value::~Value(&local_120);
      this_00 = &local_b8;
    }
    std::__cxx11::string::~string((string *)this_00);
    this_01 = &usage;
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessHelp(const Expression &aExpr)
{
    Value value;

    if (aExpr.size() == 1)
    {
        std::string data;
        for (const auto &kv : mEvaluatorMap)
        {
            data += kv.first + "\n";
        }
        data += "\ntype 'help <command>' for help of specific command.";
        value = data;
    }
    else
    {
        std::string usage = Usage({aExpr[1]});
        VerifyOrExit(!usage.empty(), value = ERROR_INVALID_ARGS("{} is not a valid command", aExpr[1]));
        value = "usage:\n" + usage;
    }

exit:
    return value;
}